

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall
leveldb::DBImpl::GetApproximateSizes(DBImpl *this,Range *range,int n,uint64_t *sizes)

{
  Version *this_00;
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  ulong uVar6;
  Mutex *__mutex;
  long in_FS_OFFSET;
  InternalKey k2;
  InternalKey k1;
  InternalKey local_78;
  InternalKey local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    this_00 = this->versions_->current_;
    Version::Ref(this_00);
    if (0 < n) {
      uVar6 = 0;
      do {
        InternalKey::InternalKey(&local_58,&range->start,0xffffffffffffff,kTypeValue);
        InternalKey::InternalKey(&local_78,&range->limit,0xffffffffffffff,kTypeValue);
        uVar2 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,&local_58);
        uVar3 = VersionSet::ApproximateOffsetOf(this->versions_,this_00,&local_78);
        uVar5 = 0;
        if (uVar2 <= uVar3) {
          uVar5 = uVar3 - uVar2;
        }
        sizes[uVar6] = uVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.rep_._M_dataplus._M_p != &local_78.rep_.field_2) {
          operator_delete(local_78.rep_._M_dataplus._M_p,
                          local_78.rep_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.rep_._M_dataplus._M_p != &local_58.rep_.field_2) {
          operator_delete(local_58.rep_._M_dataplus._M_p,
                          local_58.rep_.field_2._M_allocated_capacity + 1);
        }
        uVar6 = uVar6 + 1;
        range = range + 1;
      } while ((uint)n != uVar6);
    }
    Version::Unref(this_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar4 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::GetApproximateSizes(const Range* range, int n, uint64_t* sizes) {
  // TODO(opt): better implementation
  MutexLock l(&mutex_);
  Version* v = versions_->current();
  v->Ref();

  for (int i = 0; i < n; i++) {
    // Convert user_key into a corresponding internal key.
    InternalKey k1(range[i].start, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey k2(range[i].limit, kMaxSequenceNumber, kValueTypeForSeek);
    uint64_t start = versions_->ApproximateOffsetOf(v, k1);
    uint64_t limit = versions_->ApproximateOffsetOf(v, k2);
    sizes[i] = (limit >= start ? limit - start : 0);
  }

  v->Unref();
}